

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

bool __thiscall
CppJieba::Trie::find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          *res)

{
  pointer pTVar1;
  iterator __position;
  __node_base_ptr p_Var2;
  mapped_type *ppTVar3;
  ulong uVar4;
  mapped_type this_00;
  int iVar5;
  ulong uVar6;
  string local_68;
  vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
  *local_48;
  Trie *local_40;
  unsigned_short *local_38;
  
  if (this->_initFlag == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"trie not initted!","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xd6,&local_68);
  }
  else {
    if (begin._M_current < end._M_current) {
      this_00 = this->_root;
      iVar5 = 0;
      local_48 = (vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
                  *)res;
      local_40 = this;
      local_38 = end._M_current;
      do {
        p_Var2 = std::
                 _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           ((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this_00,
                            (ulong)*begin._M_current % (this_00->hmap)._M_h._M_bucket_count,
                            begin._M_current,(ulong)*begin._M_current);
        if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) break;
        ppTVar3 = std::__detail::
                  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,begin._M_current);
        this_00 = *ppTVar3;
        if (this_00->isLeaf == true) {
          uVar4 = (ulong)this_00->nodeInfoVecPos;
          pTVar1 = (this->_nodeInfoVec).
                   super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(this->_nodeInfoVec).
                         super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) *
                  -0x71c71c71c71c71c7;
          if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"node\'s nodeInfoVecPos is out of _nodeInfoVec\'s range",
                       "");
            Limonp::Logger::LoggingF(4,"Trie.hpp",0xef,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
          }
          else {
            local_68._M_string_length = (size_type)(pTVar1 + uVar4);
            local_68._M_dataplus._M_p._0_4_ = iVar5;
            __position._M_current =
                 *(pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> **)(local_48 + 8);
            if (__position._M_current ==
                *(pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> **)(local_48 + 0x10)) {
              std::
              vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>
                        (local_48,__position,
                         (pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> *)&local_68);
            }
            else {
              *(pointer *)__position._M_current = local_68._M_dataplus._M_p;
              (__position._M_current)->second = (TrieNodeInfo *)local_68._M_string_length;
              *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
            }
          }
          end._M_current = local_38;
          this = local_40;
          if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
            return false;
          }
        }
        begin._M_current = begin._M_current + 1;
        iVar5 = iVar5 + 1;
      } while (begin._M_current != end._M_current);
      return *(pointer *)local_48 != *(pointer *)(local_48 + 8);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"begin >= end","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xdb,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool find(Unicode::const_iterator begin, Unicode::const_iterator end, vector<pair<uint, const TrieNodeInfo*> >& res) const
            {
                if(!_getInitFlag())
                {
                    LogFatal("trie not initted!");
                    return false;
                }
                if (begin >= end) 
                {
                    LogFatal("begin >= end");
                    return false;
                }
                TrieNode* p = _root;
                for (Unicode::const_iterator itr = begin; itr != end; itr++)
                {
                    if(p->hmap.find(*itr) == p-> hmap.end())
                    {
                        break;
                    }
                    p = p->hmap[*itr];
                    if(p->isLeaf)
                    {
                        uint pos = p->nodeInfoVecPos;
                        if(pos < _nodeInfoVec.size())
                        {
                            res.push_back(make_pair(itr-begin, &_nodeInfoVec[pos]));
                        }
                        else
                        {
                            LogFatal("node's nodeInfoVecPos is out of _nodeInfoVec's range");
                            return false;
                        }
                    }
                }
                return !res.empty();
            }